

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcRtFileFont.cpp
# Opt level: O3

byte * __thiscall GrcRtFileFont::readTable(GrcRtFileFont *this,int tid,size_t *size)

{
  size_t __n;
  bool bVar1;
  byte *__ptr;
  size_t sVar2;
  size_t lSize;
  size_t lOffset;
  size_t local_38;
  size_t local_30;
  
  local_30 = 0;
  local_38 = 0;
  *size = 0;
  bVar1 = TtfUtil::GetTableInfo(tid,this->m_pHeader,this->m_pTableDir,&local_30,&local_38);
  if (bVar1) {
    fseek((FILE *)this->m_file,local_30,0);
    __n = local_38;
    __ptr = (byte *)operator_new__(local_38);
    sVar2 = fread(__ptr,1,__n,(FILE *)this->m_file);
    if (((long)(int)sVar2 == local_38) &&
       (bVar1 = TtfUtil::CheckTable(tid,__ptr,(long)(int)sVar2), bVar1)) {
      *size = local_38;
      return __ptr;
    }
  }
  return (byte *)0x0;
}

Assistant:

gr::byte * GrcRtFileFont::readTable(int /*TableId*/ tid, size_t & size)
{
	TableId tableId = static_cast<TableId>(tid);
	bool isValid = true;
	size_t lOffset = 0, lSize = 0;
	//if (!m_pTableCache)
	//{
	//	m_pTableCache = new FontTableCache();		
	//}
	//if (!m_pTableCache) return NULL;
	
	gr::byte * pTable = NULL; // m_pTableCache->getTable(tableId);
	size = 0; // m_pTableCache->getTableSize(tableId);
	// check whether it is already in the cache
	//if (pTable) return pTable;
	isValid &= TtfUtil::GetTableInfo(tableId, m_pHeader, m_pTableDir, 
									  lOffset, lSize);
	if (!isValid) 
		return NULL;
	fseek(m_file, lOffset, SEEK_SET);

	//pTable = m_pTableCache->allocateTable(tableId, lSize);
	pTable = new gr::byte[lSize]; 
	if (!pTable) 
	{
		isValid = false;
		return NULL;
	}
	size_t bytesRead = fread(pTable, 1, lSize, m_file);
	isValid = (static_cast<int>(bytesRead) == lSize);
	if (isValid)
	{
		isValid &= TtfUtil::CheckTable(tableId, pTable, lSize);
	}
	if (!isValid) 
	{
		return NULL;
	}
	size = lSize;
	return pTable;
}